

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  aiFace *paVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  aiMatrix4x4 *paVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  pointer pBVar5;
  pointer pBVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Vertex *pVVar21;
  aiMesh **ppaVar22;
  aiMesh *paVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  aiFace *paVar27;
  aiVector3D *__s;
  aiVector3D *__s_00;
  uint *puVar28;
  Logger *pLVar29;
  aiBone **ppaVar30;
  aiBone *paVar31;
  aiVertexWeight *__s_01;
  long lVar32;
  pointer ppVar33;
  uint uVar34;
  uint uVar35;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar36;
  aiScene *paVar37;
  ulong *puVar38;
  pointer pFVar39;
  uint iVert;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  uint local_cc;
  undefined8 local_c8;
  ulong local_c0;
  uint local_b4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  aiVector3D *local_a8;
  aiVector3D *local_a0;
  aiVector3D *local_98;
  ulong *local_90;
  undefined1 local_88 [8];
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ulong *local_68;
  aiMesh **local_60;
  ulong *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  Vertex *local_40;
  long local_38;
  
  if ((this->aszTextures).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->aszTextures).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_88 = (undefined1  [8])&local_78;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->aszTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88,
                      CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
    }
  }
  this->pScene->mNumMeshes =
       (uint)((ulong)((long)(this->aszTextures).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->aszTextures).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  paVar37 = this->pScene;
  ppaVar22 = (aiMesh **)operator_new__((ulong)paVar37->mNumMeshes << 3);
  paVar37->mMeshes = ppaVar22;
  paVar37 = this->pScene;
  uVar34 = paVar37->mNumMeshes;
  uVar42 = (ulong)uVar34;
  local_58 = (ulong *)operator_new__(uVar42 * 0x18 + 8);
  *local_58 = uVar42;
  pvVar36 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_58 + 1);
  if (uVar34 != 0) {
    memset(pvVar36,0,((uVar42 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  uVar42 = (ulong)(uint)((int)((ulong)((long)(this->asTriangles).
                                             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->asTriangles).
                                            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x3d70a3d7) / (ulong)paVar37->mNumMeshes;
  local_cc = (int)(uVar42 >> 1) + (int)uVar42;
  if (this->pScene->mNumMeshes != 0) {
    uVar42 = 0;
    this_01 = pvVar36;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_01,(ulong)local_cc);
      uVar42 = uVar42 + 1;
      this_01 = this_01 + 1;
    } while (uVar42 < this->pScene->mNumMeshes);
  }
  local_cc = 0;
  pFVar39 = (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_b0 = pvVar36;
  if (pFVar39 !=
      (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar42 = (ulong)pFVar39->iTexture;
      if (uVar42 == 0xffffffff) {
        pvVar36 = local_b0 + 0xffffffff;
        local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffff00000000);
LAB_00625a82:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (pvVar36,(uint *)local_88);
      }
      else {
        if ((ulong)((long)(this->aszTextures).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->aszTextures).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar42) {
          pLVar29 = DefaultLogger::get();
          Logger::info(pLVar29,"[SMD/VTA] Material index overflow in face");
          pvVar36 = local_b0 + pFVar39->iTexture;
          local_88._0_4_ =
               (int)((ulong)((long)(this->aszTextures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->aszTextures).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          goto LAB_00625a82;
        }
        this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_b0 + uVar42);
        __position._M_current = *(uint **)(this_00 + 8);
        if (__position._M_current == *(uint **)(this_00 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_cc);
        }
        else {
          *__position._M_current = local_cc;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
        }
      }
      local_cc = local_cc + 1;
      pFVar39 = pFVar39 + 1;
    } while (pFVar39 !=
             (this->asTriangles).
             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  paVar37 = this->pScene;
  if (paVar37->mNumMeshes != 0) {
    uVar34 = 0;
    do {
      local_b4 = uVar34;
      paVar23 = (aiMesh *)operator_new(0x520);
      paVar23->mPrimitiveTypes = 0;
      paVar23->mNumVertices = 0;
      paVar23->mNumFaces = 0;
      memset(&paVar23->mVertices,0,0xcc);
      paVar23->mBones = (aiBone **)0x0;
      paVar23->mMaterialIndex = 0;
      (paVar23->mName).length = 0;
      (paVar23->mName).data[0] = '\0';
      memset((paVar23->mName).data + 1,0x1b,0x3ff);
      paVar23->mNumAnimMeshes = 0;
      paVar23->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar23->mMethod = 0;
      (paVar23->mAABB).mMin.x = 0.0;
      (paVar23->mAABB).mMin.y = 0.0;
      (paVar23->mAABB).mMin.z = 0.0;
      (paVar23->mAABB).mMax.x = 0.0;
      (paVar23->mAABB).mMax.y = 0.0;
      (paVar23->mAABB).mMax.z = 0.0;
      paVar23->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar23->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar23->mNumUVComponents[0] = 0;
      paVar23->mNumUVComponents[1] = 0;
      paVar23->mNumUVComponents[2] = 0;
      paVar23->mNumUVComponents[3] = 0;
      paVar23->mNumUVComponents[4] = 0;
      paVar23->mNumUVComponents[5] = 0;
      paVar23->mNumUVComponents[6] = 0;
      paVar23->mNumUVComponents[7] = 0;
      paVar23->mColors[0] = (aiColor4D *)0x0;
      paVar23->mColors[1] = (aiColor4D *)0x0;
      paVar23->mColors[2] = (aiColor4D *)0x0;
      paVar23->mColors[3] = (aiColor4D *)0x0;
      paVar23->mColors[4] = (aiColor4D *)0x0;
      paVar23->mColors[5] = (aiColor4D *)0x0;
      paVar23->mColors[6] = (aiColor4D *)0x0;
      paVar23->mColors[7] = (aiColor4D *)0x0;
      ppaVar22 = paVar37->mMeshes;
      uVar42 = (ulong)local_b4;
      ppaVar22[uVar42] = paVar23;
      puVar3 = local_b0[uVar42].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = local_b0[uVar42].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar3 == puVar4) {
        __assert_fail("!aaiFaces[i].empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                      ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
      }
      local_50 = local_b0 + uVar42;
      paVar23->mPrimitiveTypes = 4;
      ppaVar22[uVar42]->mNumVertices = (int)((ulong)((long)puVar4 - (long)puVar3) >> 2) * 3;
      ppaVar22[uVar42]->mNumFaces =
           (uint)((ulong)((long)(local_50->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_50->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      ppaVar22[uVar42]->mMaterialIndex = local_b4;
      pBVar5 = (this->asBones).
               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar6 = (this->asBones).
               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar40 = (long)pBVar5 - (long)pBVar6 >> 4;
      uVar41 = lVar40 * -0x71c71c71c71c71c7;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar41;
      uVar24 = SUB168(auVar8 * ZEXT816(0x18),0);
      uVar25 = uVar24 + 8;
      if (0xfffffffffffffff7 < uVar24) {
        uVar25 = 0xffffffffffffffff;
      }
      if (SUB168(auVar8 * ZEXT816(0x18),8) != 0) {
        uVar25 = 0xffffffffffffffff;
      }
      local_c0 = uVar42;
      local_68 = (ulong *)operator_new__(uVar25);
      uVar42 = local_c0;
      puVar38 = local_68 + 1;
      *local_68 = uVar41;
      if (pBVar5 != pBVar6) {
        lVar32 = 0;
        do {
          *(undefined8 *)((long)puVar38 + lVar32) = 0;
          ((undefined8 *)((long)puVar38 + lVar32))[1] = 0;
          *(undefined8 *)((long)local_68 + lVar32 + 0x18) = 0;
          lVar32 = lVar32 + 0x18;
        } while (lVar40 * 0x5555555555555558 != lVar32);
      }
      lVar40 = (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar40 != 0) {
        uVar41 = (lVar40 >> 4) * -0x71c71c71c71c71c7;
        uVar24 = 0;
        uVar25 = 1;
        do {
          std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)(puVar38 + uVar24 * 3),ppaVar22[uVar42]->mNumVertices / uVar41);
          uVar41 = ((long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
          bVar43 = uVar25 <= uVar41;
          lVar40 = uVar41 - uVar25;
          uVar24 = uVar25;
          uVar25 = (ulong)((int)uVar25 + 1);
        } while (bVar43 && lVar40 != 0);
      }
      uVar42 = (ulong)ppaVar22[uVar42]->mNumFaces;
      puVar26 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar26 + 1);
      *puVar26 = uVar42;
      if (uVar42 != 0) {
        paVar27 = paVar1;
        do {
          paVar27->mNumIndices = 0;
          paVar27->mIndices = (uint *)0x0;
          paVar27 = paVar27 + 1;
        } while (paVar27 != paVar1 + uVar42);
      }
      ppaVar22[local_c0]->mFaces = paVar1;
      uVar34 = ppaVar22[local_c0]->mNumVertices;
      local_a0 = (aiVector3D *)operator_new__((ulong)uVar34 * 0xc);
      if (uVar34 != 0) {
        memset(local_a0,0,(((ulong)uVar34 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppaVar22[local_c0]->mNormals = local_a0;
      uVar34 = ppaVar22[local_c0]->mNumVertices;
      __s = (aiVector3D *)operator_new__((ulong)uVar34 * 0xc);
      if (uVar34 != 0) {
        memset(__s,0,(((ulong)uVar34 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppaVar22[local_c0]->mVertices = __s;
      if (this->bHasUVs == true) {
        uVar34 = ppaVar22[local_c0]->mNumVertices;
        local_98 = __s;
        __s_00 = (aiVector3D *)operator_new__((ulong)uVar34 * 0xc);
        if (uVar34 != 0) {
          memset(__s_00,0,(((ulong)uVar34 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        ppaVar22[local_c0]->mTextureCoords[0] = __s_00;
        ppaVar22[local_c0]->mNumUVComponents[0] = 2;
        __s = local_98;
        local_a8 = __s_00;
      }
      else {
        local_a8 = (aiVector3D *)0x0;
      }
      local_cc = 0;
      local_90 = puVar38;
      local_60 = ppaVar22;
      if (ppaVar22[local_c0]->mNumFaces != 0) {
        uVar42 = 0;
        do {
          uVar24 = local_c0;
          puVar28 = (uint *)operator_new__(0xc);
          local_38 = uVar42 * 0x10;
          ppaVar22[uVar24]->mFaces[uVar42].mIndices = puVar28;
          ppaVar22[uVar24]->mFaces[uVar42].mNumIndices = 3;
          uVar34 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar42];
          pFVar39 = (this->asTriangles).
                    super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          __s->z = pFVar39[uVar34].avVertices[0].pos.z;
          fVar12 = pFVar39[uVar34].avVertices[0].pos.y;
          __s->x = pFVar39[uVar34].avVertices[0].pos.x;
          __s->y = fVar12;
          __s[1].z = pFVar39[uVar34].avVertices[1].pos.z;
          fVar12 = pFVar39[uVar34].avVertices[1].pos.y;
          __s[1].x = pFVar39[uVar34].avVertices[1].pos.x;
          __s[1].y = fVar12;
          __s[2].z = pFVar39[uVar34].avVertices[2].pos.z;
          fVar12 = pFVar39[uVar34].avVertices[2].pos.y;
          __s[2].x = pFVar39[uVar34].avVertices[2].pos.x;
          __s[2].y = fVar12;
          local_a0->z = pFVar39[uVar34].avVertices[0].nor.z;
          fVar12 = pFVar39[uVar34].avVertices[0].nor.y;
          local_a0->x = pFVar39[uVar34].avVertices[0].nor.x;
          local_a0->y = fVar12;
          fVar12 = pFVar39[uVar34].avVertices[1].nor.y;
          local_a0[1].x = pFVar39[uVar34].avVertices[1].nor.x;
          local_a0[1].y = fVar12;
          local_a0[1].z = pFVar39[uVar34].avVertices[1].nor.z;
          fVar12 = pFVar39[uVar34].avVertices[2].nor.y;
          local_a0[2].x = pFVar39[uVar34].avVertices[2].nor.x;
          local_a0[2].y = fVar12;
          local_a0[2].z = pFVar39[uVar34].avVertices[2].nor.z;
          if (local_a8 == (aiVector3D *)0x0) {
            local_a8 = (aiVector3D *)0x0;
          }
          else {
            local_a8->z = pFVar39[uVar34].avVertices[0].uv.z;
            fVar12 = pFVar39[uVar34].avVertices[0].uv.y;
            local_a8->x = pFVar39[uVar34].avVertices[0].uv.x;
            local_a8->y = fVar12;
            fVar12 = pFVar39[uVar34].avVertices[1].uv.y;
            local_a8[1].x = pFVar39[uVar34].avVertices[1].uv.x;
            local_a8[1].y = fVar12;
            local_a8[1].z = pFVar39[uVar34].avVertices[1].uv.z;
            fVar12 = pFVar39[uVar34].avVertices[2].uv.y;
            local_a8[2].x = pFVar39[uVar34].avVertices[2].uv.x;
            local_a8[2].y = fVar12;
            local_a8[2].z = pFVar39[uVar34].avVertices[2].uv.z;
            local_a8 = local_a8 + 3;
          }
          local_40 = pFVar39[uVar34].avVertices;
          local_98 = __s + 3;
          local_a0 = local_a0 + 3;
          lVar40 = 0;
          local_48 = uVar42;
          do {
            pVVar21 = local_40;
            ppVar33 = *(pointer *)
                       &local_40[lVar40].aiBoneLinks.
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl;
            if (*(pointer *)
                 ((long)&local_40[lVar40].aiBoneLinks.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl + 8) == ppVar33) {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
            }
            else {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
              uVar34 = 1;
              uVar42 = 0;
              do {
                uVar24 = (ulong)ppVar33[uVar42].first;
                uVar25 = ((long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7;
                if ((uVar25 < uVar24 || uVar25 - uVar24 == 0) ||
                   (ppVar33[uVar42].first == pVVar21[lVar40].iParentNode)) {
                  pLVar29 = DefaultLogger::get();
                  Logger::error(pLVar29,
                                "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                               );
                }
                else {
                  local_88._4_4_ = ppVar33[uVar42].second;
                  local_88._0_4_ = local_cc;
                  std::
                  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  ::emplace_back<std::pair<unsigned_int,float>>
                            ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                              *)(local_90 + uVar24 * 3),(pair<unsigned_int,_float> *)local_88);
                  local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8 + ppVar33[uVar42].second);
                }
                uVar42 = (ulong)uVar34;
                ppVar33 = pVVar21[lVar40].aiBoneLinks.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar34 = uVar34 + 1;
              } while (uVar42 < (ulong)((long)*(pointer *)
                                               ((long)&pVVar21[lVar40].aiBoneLinks.
                                                                                                              
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl + 8) - (long)ppVar33 >> 3));
            }
            ppaVar22 = local_60;
            puVar38 = local_90;
            if (((float)local_c8 < 0.975) &&
               (uVar42 = (ulong)pVVar21[lVar40].iParentNode, uVar42 != 0xffffffff)) {
              uVar24 = ((long)(this->asBones).
                              super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->asBones).
                              super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
              if (uVar24 < uVar42 || uVar24 - uVar42 == 0) {
                pLVar29 = DefaultLogger::get();
                Logger::error(pLVar29,
                              "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                             );
                if ((((float)local_c8 != 0.0) || (NAN((float)local_c8))) &&
                   (ppVar33 = pVVar21[lVar40].aiBoneLinks.
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pVVar21[lVar40].aiBoneLinks.
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl + 8) != ppVar33)) {
                  uVar34 = 1;
                  uVar42 = 0;
                  do {
                    uVar42 = (ulong)ppVar33[uVar42].first;
                    uVar24 = ((long)(this->asBones).
                                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->asBones).
                                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x71c71c71c71c71c7;
                    if (uVar42 <= uVar24 && uVar24 - uVar42 != 0) {
                      *(float *)(puVar38[uVar42 * 3 + 1] - 4) =
                           *(float *)(puVar38[uVar42 * 3 + 1] - 4) * (1.0 / (float)local_c8);
                    }
                    uVar42 = (ulong)uVar34;
                    ppVar33 = pVVar21[lVar40].aiBoneLinks.
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar34 = uVar34 + 1;
                  } while (uVar42 < (ulong)((long)*(pointer *)
                                                   ((long)&pVVar21[lVar40].aiBoneLinks.
                                                                                                                      
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl + 8) - (long)ppVar33 >> 3));
                }
              }
              else {
                local_88._4_4_ = 1.0 - (float)local_c8;
                local_88._0_4_ = local_cc;
                std::
                vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                ::emplace_back<std::pair<unsigned_int,float>>
                          ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_90 + uVar42 * 3),(pair<unsigned_int,_float> *)local_88);
              }
            }
            uVar34 = local_cc + 1;
            *(uint *)(*(long *)((long)&ppaVar22[local_c0]->mFaces->mIndices + local_38) + lVar40 * 4
                     ) = local_cc;
            lVar40 = lVar40 + 1;
            local_cc = uVar34;
          } while (lVar40 != 3);
          uVar42 = local_48 + 1;
          __s = local_98;
        } while (uVar42 < ppaVar22[local_c0]->mNumFaces);
      }
      uVar42 = local_c0;
      local_cc = 0;
      lVar40 = (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar40 != 0) {
        uVar24 = (lVar40 >> 4) * -0x71c71c71c71c71c7;
        uVar34 = 0;
        puVar26 = local_68 + 2;
        uVar35 = 1;
        do {
          if (puVar26[-1] != *puVar26) {
            uVar34 = uVar34 + 1;
            local_cc = uVar34;
          }
          uVar25 = (ulong)uVar35;
          puVar26 = puVar26 + 3;
          uVar35 = uVar35 + 1;
        } while (uVar25 <= uVar24 && uVar24 - uVar25 != 0);
      }
      if (local_cc != 0) {
        ppaVar22[local_c0]->mNumBones = local_cc;
        ppaVar30 = (aiBone **)operator_new__((ulong)ppaVar22[local_c0]->mNumBones << 3);
        ppaVar22[uVar42]->mBones = ppaVar30;
        local_cc = 0;
        if ((this->asBones).
            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->asBones).
            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar24 = 0;
          do {
            if (puVar38[uVar24 * 3] != puVar38[uVar24 * 3 + 1]) {
              puVar38 = puVar38 + uVar24 * 3;
              paVar31 = (aiBone *)operator_new(0x460);
              (paVar31->mName).length = 0;
              (paVar31->mName).data[0] = '\0';
              memset((paVar31->mName).data + 1,0x1b,0x3ff);
              paVar31->mNumWeights = 0;
              paVar31->mWeights = (aiVertexWeight *)0x0;
              (paVar31->mOffsetMatrix).a1 = 1.0;
              (paVar31->mOffsetMatrix).a2 = 0.0;
              (paVar31->mOffsetMatrix).a3 = 0.0;
              (paVar31->mOffsetMatrix).a4 = 0.0;
              (paVar31->mOffsetMatrix).b1 = 0.0;
              (paVar31->mOffsetMatrix).b2 = 1.0;
              (paVar31->mOffsetMatrix).b3 = 0.0;
              (paVar31->mOffsetMatrix).b4 = 0.0;
              (paVar31->mOffsetMatrix).c1 = 0.0;
              (paVar31->mOffsetMatrix).c2 = 0.0;
              (paVar31->mOffsetMatrix).c3 = 1.0;
              (paVar31->mOffsetMatrix).c4 = 0.0;
              (paVar31->mOffsetMatrix).d1 = 0.0;
              (paVar31->mOffsetMatrix).d2 = 0.0;
              (paVar31->mOffsetMatrix).d3 = 0.0;
              (paVar31->mOffsetMatrix).d4 = 1.0;
              ppaVar30 = ppaVar22[uVar42]->mBones;
              uVar42 = (ulong)local_cc;
              ppaVar30[uVar42] = paVar31;
              paVar31->mNumWeights = (uint)(puVar38[1] - *puVar38 >> 3);
              uVar34 = ppaVar30[uVar42]->mNumWeights;
              local_c8 = (ulong)uVar34 * 8;
              __s_01 = (aiVertexWeight *)operator_new__(local_c8);
              if ((ulong)uVar34 != 0) {
                memset(__s_01,0,local_c8);
              }
              ppaVar30[uVar42]->mWeights = __s_01;
              pBVar5 = (this->asBones).
                       super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar31 = ppaVar30[uVar42];
              paVar2 = &pBVar5[uVar24].mOffsetMatrix;
              fVar17 = paVar2->a1;
              fVar18 = paVar2->a2;
              fVar19 = paVar2->a3;
              fVar20 = paVar2->a4;
              pBVar6 = pBVar5 + uVar24;
              fVar15 = (pBVar6->mOffsetMatrix).b1;
              fVar16 = (pBVar6->mOffsetMatrix).b2;
              uVar9 = *(undefined8 *)(&(pBVar6->mOffsetMatrix).b1 + 2);
              pBVar6 = pBVar5 + uVar24;
              fVar13 = (pBVar6->mOffsetMatrix).c1;
              fVar14 = (pBVar6->mOffsetMatrix).c2;
              uVar10 = *(undefined8 *)(&(pBVar6->mOffsetMatrix).c1 + 2);
              pBVar5 = pBVar5 + uVar24;
              fVar12 = (pBVar5->mOffsetMatrix).d2;
              uVar11 = *(undefined8 *)(&(pBVar5->mOffsetMatrix).d1 + 2);
              (paVar31->mOffsetMatrix).d1 = (pBVar5->mOffsetMatrix).d1;
              (paVar31->mOffsetMatrix).d2 = fVar12;
              *(undefined8 *)&(paVar31->mOffsetMatrix).d3 = uVar11;
              (paVar31->mOffsetMatrix).c1 = fVar13;
              (paVar31->mOffsetMatrix).c2 = fVar14;
              *(undefined8 *)&(paVar31->mOffsetMatrix).c3 = uVar10;
              (paVar31->mOffsetMatrix).b1 = fVar15;
              (paVar31->mOffsetMatrix).b2 = fVar16;
              *(undefined8 *)&(paVar31->mOffsetMatrix).b3 = uVar9;
              (paVar31->mOffsetMatrix).a1 = fVar17;
              (paVar31->mOffsetMatrix).a2 = fVar18;
              (paVar31->mOffsetMatrix).a3 = fVar19;
              (paVar31->mOffsetMatrix).a4 = fVar20;
              pBVar5 = (this->asBones).
                       super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar25 = pBVar5[uVar24].mName._M_string_length;
              if (uVar25 < 0x400) {
                paVar31 = ppaVar30[uVar42];
                (paVar31->mName).length = (ai_uint32)uVar25;
                local_c8 = uVar25;
                memcpy((paVar31->mName).data,pBVar5[uVar24].mName._M_dataplus._M_p,uVar25);
                (paVar31->mName).data[local_c8] = '\0';
              }
              (this->asBones).
              super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24].bIsUsed = true;
              paVar31 = ppaVar30[uVar42];
              if (paVar31->mNumWeights != 0) {
                uVar25 = 0;
                do {
                  paVar31->mWeights[uVar25].mVertexId = *(uint *)(*puVar38 + uVar25 * 8);
                  ppaVar30[uVar42]->mWeights[uVar25].mWeight = *(float *)(*puVar38 + 4 + uVar25 * 8)
                  ;
                  uVar25 = uVar25 + 1;
                  paVar31 = ppaVar30[uVar42];
                } while (uVar25 < paVar31->mNumWeights);
              }
              local_cc = local_cc + 1;
              puVar38 = local_90;
              ppaVar22 = local_60;
              uVar42 = local_c0;
            }
            uVar24 = (ulong)((int)uVar24 + 1);
            uVar25 = ((long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
          } while (uVar24 <= uVar25 && uVar25 - uVar24 != 0);
        }
      }
      puVar38 = local_68;
      uVar42 = *local_68 * 0x18;
      uVar24 = uVar42;
      uVar25 = *local_68;
      while (uVar25 != 0) {
        pvVar7 = *(void **)((long)puVar38 + (uVar24 - 0x10));
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,*(long *)((long)puVar38 + uVar24) - (long)pvVar7);
        }
        uVar24 = uVar24 - 0x18;
        uVar25 = uVar24;
      }
      operator_delete__(puVar38,uVar42 + 8);
      uVar34 = local_b4 + 1;
      paVar37 = this->pScene;
    } while (uVar34 < paVar37->mNumMeshes);
  }
  puVar38 = local_58;
  uVar42 = *local_58 * 0x18;
  uVar24 = uVar42;
  uVar25 = *local_58;
  while (uVar25 != 0) {
    pvVar7 = *(void **)((long)puVar38 + (uVar24 - 0x10));
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,*(long *)((long)puVar38 + uVar24) - (long)pvVar7);
    }
    uVar24 = uVar24 - 0x18;
    uVar25 = uVar24;
  }
  operator_delete__(puVar38,uVar42 + 8);
  return;
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}